

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O1

int __thiscall Fl_Counter::calc_mouseobj(Fl_Counter *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
    iVar2 = (iVar2 * 0xf) / 100;
    iVar1 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_,
                             (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                             (this->super_Fl_Valuator).super_Fl_Widget.h_);
    if (iVar1 == 0) {
      iVar1 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar2,
                               (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                               (this->super_Fl_Valuator).super_Fl_Widget.h_);
      if (iVar1 != 0) goto LAB_001ab4e4;
      iVar1 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar2 * -2 +
                               (this->super_Fl_Valuator).super_Fl_Widget.w_,
                               (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                               (this->super_Fl_Valuator).super_Fl_Widget.h_);
      if (iVar1 == 0) {
        iVar2 = Fl::event_inside(((this->super_Fl_Valuator).super_Fl_Widget.x_ - iVar2) +
                                 (this->super_Fl_Valuator).super_Fl_Widget.w_,
                                 (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                                 (this->super_Fl_Valuator).super_Fl_Widget.h_);
        bVar3 = iVar2 == 0;
        iVar2 = 4;
        goto LAB_001ab547;
      }
      iVar2 = 3;
    }
    else {
      iVar2 = 1;
    }
  }
  else {
    iVar2 = iVar2 / 5;
    iVar1 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_,
                             (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                             (this->super_Fl_Valuator).super_Fl_Widget.h_);
    if (iVar1 == 0) {
      iVar2 = Fl::event_inside(((this->super_Fl_Valuator).super_Fl_Widget.x_ - iVar2) +
                               (this->super_Fl_Valuator).super_Fl_Widget.w_,
                               (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                               (this->super_Fl_Valuator).super_Fl_Widget.h_);
      bVar3 = iVar2 == 0;
      iVar2 = 3;
      goto LAB_001ab547;
    }
LAB_001ab4e4:
    iVar2 = 2;
  }
  bVar3 = false;
LAB_001ab547:
  if (bVar3) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Fl_Counter::calc_mouseobj() {
  if (type() == FL_NORMAL_COUNTER) {
    int W = w()*15/100;
    if (Fl::event_inside(x(), y(), W, h())) return 1;
    if (Fl::event_inside(x()+W, y(), W, h())) return 2;
    if (Fl::event_inside(x()+w()-2*W, y(), W, h())) return 3;
    if (Fl::event_inside(x()+w()-W, y(), W, h())) return 4;
  } else {
    int W = w()*20/100;
    if (Fl::event_inside(x(), y(), W, h())) return 2;
    if (Fl::event_inside(x()+w()-W, y(), W, h())) return 3;
  }
  return -1;
}